

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void do_storms(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int dx;
  
  if (((level->flags).field_0xa & 4) != 0) {
    uVar1 = mt_random();
    if ((uVar1 & 7) == 0) {
      for (uVar1 = rnd(0x40); uVar1 < 0x41; uVar1 = uVar1 * 2) {
        iVar5 = 100;
        do {
          uVar2 = rnd(0x4f);
          uVar3 = mt_random();
          iVar5 = iVar5 + -1;
          if (iVar5 == 0) goto LAB_0024bcb2;
        } while (level->locations[uVar2][(ulong)uVar3 % 0x15].typ != '&');
        uVar4 = mt_random();
        dx = uVar4 % 3 - 1;
        uVar4 = mt_random();
        iVar5 = uVar4 % 3 - 1;
        if (dx != 0 || iVar5 != 0) {
          buzz(-0xf,8,(xchar)uVar2,(xchar)((ulong)uVar3 % 0x15),dx,iVar5);
        }
LAB_0024bcb2:
      }
      if (level->locations[u.ux][u.uy].typ != '&') {
        You_hear("a rumbling noise.");
        return;
      }
      pline("Kaboom!!!  Boom!!  Boom!!");
      if ((u._1052_1_ & 0x10) == 0) {
        stop_occupation();
        nomul(-3,"hiding from a thunderstorm");
        return;
      }
    }
  }
  return;
}

Assistant:

void do_storms(void)
{
    int nstrike;
    int x, y;
    int dirx, diry;
    int count;

    /* no lightning if not stormy level or too often, even then */
    if (!level->flags.stormy || rn2(8))
	return;

    /* the number of strikes is 8-log2(nstrike) */
    for (nstrike = rnd(64); nstrike <= 64; nstrike *= 2) {
	count = 0;
	do {
	    x = rnd(COLNO-1);
	    y = rn2(ROWNO);
	} while (++count < 100 && level->locations[x][y].typ != CLOUD);

	if (count < 100) {
	    dirx = rn2(3) - 1;
	    diry = rn2(3) - 1;
	    if (dirx != 0 || diry != 0)
		buzz(-15, /* "monster" LIGHTNING spell */
		     8, x, y, dirx, diry);
	}
    }

    if (level->locations[u.ux][u.uy].typ == CLOUD) {
	/* inside a cloud during a thunder storm is deafening */
	pline("Kaboom!!!  Boom!!  Boom!!");
	if (!u.uinvulnerable) {
	    stop_occupation();
	    nomul(-3, "hiding from a thunderstorm");
	}
    } else
	You_hear("a rumbling noise.");
}